

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void add_format(FMFormat_conflict f,FMFormat_conflict *sorted,FMFormat_conflict *visited,
               FMFormat_conflict *stack)

{
  int iVar1;
  undefined1 *__base;
  FMFormat_conflict *in_RCX;
  FMFormat_conflict *in_RDX;
  FMFormat_conflict in_RSI;
  FMFormat_conflict in_RDI;
  int i;
  int count;
  FMFormat_conflict *tmp_list;
  FMFormat_conflict tmp [100];
  int local_358;
  int local_354;
  undefined1 local_348 [800];
  FMFormat_conflict *in_stack_ffffffffffffffd8;
  
  iVar1 = on_list(in_RDI,in_RDX);
  if (iVar1 == 0) {
    __base = local_348;
    if (99 < (uint)in_RDI->field_count) {
      __base = (undefined1 *)ffs_malloc((size_t)__base);
    }
    local_354 = 0;
    add_to_list(in_RDI,in_RDX);
    for (local_358 = 0; local_358 < in_RDI->field_count; local_358 = local_358 + 1) {
      if (in_RDI->field_subformats[local_358] != (FMFormat_conflict)0x0) {
        *(FMFormat_conflict *)(__base + (long)local_354 * 8) = in_RDI->field_subformats[local_358];
        local_354 = local_354 + 1;
      }
    }
    qsort(__base,(long)local_354,8,compare_by_name_FMFormat);
    for (local_358 = 0; local_358 < local_354; local_358 = local_358 + 1) {
      add_format(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
    }
    add_to_list(in_RDI,(FMFormat_conflict *)in_RSI);
    if (__base != local_348) {
      free(__base);
    }
  }
  return;
}

Assistant:

static
void add_format(FMFormat f, FMFormat* sorted, FMFormat *visited, FMFormat* stack)
{
    /* if n has not been visited yet then */
    if (!on_list(f, visited)) {
	FMFormat tmp[100];
	FMFormat *tmp_list = &tmp[0];
	if (f->field_count >= (sizeof(tmp)/sizeof(tmp[0]))) {
	    tmp_list = malloc(f->field_count * sizeof(tmp[0]));
	}
	int count = 0;
	int i;
        /* mark n as visited */
	add_to_list(f, visited);

	/* get subfields and sort them by name for predictability */
	for (i=0; i < f->field_count; i++) {
	    if (f->field_subformats[i] != NULL) {
		tmp_list[count++] = f->field_subformats[i];
	    }
	}
	qsort(&tmp_list[0], count, sizeof(tmp_list[0]), compare_by_name_FMFormat);

	for (i=0; i < count; i++) {
	    add_format(tmp_list[i], sorted, visited, stack);
	}
	add_to_list(f, sorted);
	if (tmp_list != &tmp[0]) free(tmp_list);
    }
}